

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O3

int __thiscall kj::File::copy(File *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  ulong uVar1;
  long in_RCX;
  int iVar2;
  ulong in_R8;
  byte buffer [8192];
  undefined1 local_2038 [8200];
  long lVar3;
  
  if (in_R8 == 0) {
    iVar2 = 0;
  }
  else {
    lVar3 = 0;
    do {
      uVar1 = 0x2000;
      if (in_R8 < 0x2000) {
        uVar1 = in_R8;
      }
      uVar1 = (**(code **)(*(long *)src + 0x30))(src,in_RCX,local_2038,uVar1);
      (*(this->super_ReadableFile).super_FsNode._vptr_FsNode[9])(this,dst,local_2038,uVar1);
      lVar3 = lVar3 + uVar1;
      iVar2 = (int)lVar3;
      if (uVar1 < 0x2000) {
        return iVar2;
      }
      in_RCX = in_RCX + uVar1;
      dst = dst + uVar1;
      in_R8 = in_R8 - uVar1;
    } while (in_R8 != 0);
  }
  return iVar2;
}

Assistant:

size_t File::copy(uint64_t offset, const ReadableFile& from,
                  uint64_t fromOffset, uint64_t size) const {
  byte buffer[8192];

  size_t result = 0;
  while (size > 0) {
    size_t n = from.read(fromOffset, kj::arrayPtr(buffer, kj::min(sizeof(buffer), size)));
    write(offset, arrayPtr(buffer, n));
    result += n;
    if (n < sizeof(buffer)) {
      // Either we copied the amount requested or we hit EOF.
      break;
    }
    fromOffset += n;
    offset += n;
    size -= n;
  }

  return result;
}